

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  pointer pbVar1;
  __type _Var2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    pbVar1 = (this->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (uVar3 <= uVar4) {
LAB_004207e9:
      return uVar4 < uVar3;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),key);
    if (_Var2) {
      *retIdx = uVar4;
      goto LAB_004207e9;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}